

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall
bioparser::Parser<bioparser::test::PafOverlap>::Read(Parser<bioparser::test::PafOverlap> *this)

{
  uint uVar1;
  uint32_t uVar2;
  pointer pgVar3;
  char *pcVar4;
  size_type sVar5;
  Parser<bioparser::test::PafOverlap> *this_local;
  
  this->buffer_ptr_ = 0;
  pgVar3 = std::unique_ptr<gzFile_s,_int_(*)(gzFile_s_*)>::get(&this->file_);
  pcVar4 = std::vector<char,_std::allocator<char>_>::data(&this->buffer_);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
  uVar2 = gzread(pgVar3,pcVar4,sVar5 & 0xffffffff);
  this->buffer_bytes_ = uVar2;
  uVar1 = this->buffer_bytes_;
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
  return uVar1 < sVar5;
}

Assistant:

bool Read() {
    buffer_ptr_ = 0;
    buffer_bytes_ = gzread(file_.get(), buffer_.data(), buffer_.size());
    return buffer_bytes_ < buffer_.size();
  }